

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O2

void vera::addLabel(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                    *_func,Node *_node,LabelType _type,float _margin)

{
  Label *this;
  undefined4 in_stack_ffffffffffffffb8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_40;
  
  this = (Label *)operator_new(0xc0);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function(&local_40,_func);
  Label::Label(this,&local_40,_node,_type,_margin);
  addLabel((Label *)CONCAT44(_margin,in_stack_ffffffffffffffb8));
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

void addLabel(std::function<std::string(void)> _func, Node* _node, LabelType _type, float _margin) {
    addLabel( new vera::Label(_func, _node, _type, _margin) );
}